

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidConvolutionNoBias(void)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_long> *this_00;
  RepeatedField<float> *this_01;
  uint uVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  long *plVar8;
  FeatureDescription *pFVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  ConvolutionLayerParams *pCVar13;
  unsigned_long *puVar14;
  ValidPadding *pVVar15;
  WeightParams *pWVar16;
  float *pfVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_02;
  uint32_t size;
  uint uVar21;
  int iVar22;
  Arena *pAVar23;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar3 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00190ad0:
    pRVar20 = &(MStack_78.description_)->input_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar22 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar22) goto LAB_00190ad0;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar12 = pRVar3->elements[iVar22];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar19);
  if (*(long *)((long)pvVar12 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  this = &pAVar7->shape_;
  uVar1 = (pAVar7->shape_).current_size_;
  uVar2 = (pAVar7->shape_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar8 = google::protobuf::RepeatedField<long>::elements(this);
  plVar8[uVar1] = 3;
  uVar21 = uVar1 + 1;
  (pAVar7->shape_).current_size_ = uVar21;
  uVar2 = (pAVar7->shape_).total_size_;
  if (uVar21 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar8 = google::protobuf::RepeatedField<long>::elements(this);
  plVar8[uVar21] = 100;
  uVar21 = uVar1 + 2;
  (pAVar7->shape_).current_size_ = uVar21;
  uVar2 = (pAVar7->shape_).total_size_;
  if (uVar21 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar8 = google::protobuf::RepeatedField<long>::elements(this);
  plVar8[uVar21] = 100;
  this->current_size_ = uVar1 + 3;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar3 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00190c3c:
    pRVar20 = &(MStack_78.description_)->output_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar22 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar22) goto LAB_00190c3c;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar12 = pRVar3->elements[iVar22];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"probs",puVar19);
  if (*(long *)((long)pvVar12 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar23);
  }
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00190d2c:
    this_02 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_02->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_02,pNVar10);
  }
  else {
    iVar22 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar22) goto LAB_00190d2c;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar22 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar22];
  }
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00190d64:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar22 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar22) goto LAB_00190d64;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar12 = pRVar3->elements[iVar22];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3cb973);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar22 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar22 < pRVar3->allocated_size) {
      (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
      pvVar12 = pRVar3->elements[iVar22];
      goto LAB_00190dce;
    }
  }
  pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
LAB_00190dce:
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3b872d);
  if (pNVar10->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 100;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pCVar13 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::ConvolutionLayerParams>(pAVar23);
    (pNVar10->layer_).convolution_ = pCVar13;
  }
  pCVar13 = (pNVar10->layer_).convolution_;
  pCVar13->outputchannels_ = 5;
  pCVar13->kernelchannels_ = 3;
  this_00 = &pCVar13->kernelsize_;
  uVar1 = (pCVar13->kernelsize_).current_size_;
  uVar2 = (pCVar13->kernelsize_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 1);
  }
  puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar14[uVar1] = 2;
  uVar21 = uVar1 + 1;
  (pCVar13->kernelsize_).current_size_ = uVar21;
  uVar2 = (pCVar13->kernelsize_).total_size_;
  if (uVar21 == uVar2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 1);
  }
  puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar14[uVar21] = 5;
  (pCVar13->kernelsize_).current_size_ = uVar1 + 2;
  pCVar13->hasbias_ = true;
  if (pCVar13->_oneof_case_[0] != 0x32) {
    CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(pCVar13);
    pCVar13->_oneof_case_[0] = 0x32;
    uVar4 = (pCVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pVVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ValidPadding>
                        (pAVar23);
    (pCVar13->ConvolutionPaddingType_).valid_ = pVVar15;
  }
  iVar22 = 0x96;
  do {
    if (pCVar13->weights_ == (WeightParams *)0x0) {
      uVar4 = (pCVar13->super_MessageLite)._internal_metadata_.ptr_;
      pAVar23 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar23 = *(Arena **)pAVar23;
      }
      pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar23);
      pCVar13->weights_ = pWVar16;
    }
    pWVar16 = pCVar13->weights_;
    this_01 = &pWVar16->floatvalue_;
    uVar1 = (pWVar16->floatvalue_).current_size_;
    uVar2 = (pWVar16->floatvalue_).total_size_;
    if (uVar1 == uVar2) {
      google::protobuf::RepeatedField<float>::Reserve(this_01,uVar2 + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(this_01);
    pfVar17[uVar1] = 1.0;
    this_01->current_size_ = uVar1 + 1;
    iVar22 = iVar22 + -1;
  } while (iVar22 != 0);
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar5 = CoreML::Result::good(&local_48);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5c9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar5;
}

Assistant:

int testInvalidConvolutionNoBias() {

    Specification::Model m1;

    int output_channels = 5;
    int kernel_channels = 3;
    int kernel_height = 2;
    int kernel_width = 5;
    int nGroups = 1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);
    params->add_kernelsize(kernel_height);
    params->add_kernelsize(kernel_width);

    params->set_hasbias(true);

    (void)params->mutable_valid();

    for (int i = 0; i < output_channels * (kernel_channels / nGroups) * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying the right number of weights should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}